

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O0

double add_regularization<dense_parameters>
                 (vw *all,bfgs *b,float regularization,dense_parameters *weights)

{
  bool bVar1;
  uint32_t uVar2;
  float *pfVar3;
  char *pcVar4;
  weight *pwVar5;
  ulong uVar6;
  undefined4 in_EDX;
  int __c;
  undefined4 in_register_00000014;
  long in_RSI;
  dense_iterator<float> *rhs;
  long in_RDI;
  float in_XMM0_Da;
  float fVar7;
  float fVar8;
  double dVar9;
  weight delta_weight_1;
  uint64_t i_1;
  weight delta_weight;
  uint64_t i;
  iterator w_1;
  iterator w;
  double ret;
  size_t in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  float fVar10;
  undefined4 in_stack_ffffffffffffff14;
  dense_parameters *in_stack_ffffffffffffff20;
  dense_iterator<float> local_88;
  dense_iterator<float> local_70;
  dense_iterator<float> local_58;
  dense_iterator<float> local_40;
  double local_28;
  dense_parameters *local_20;
  float local_14;
  long local_10;
  long local_8;
  
  local_20 = (dense_parameters *)CONCAT44(in_register_00000014,in_EDX);
  local_28 = 0.0;
  local_14 = in_XMM0_Da;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (*(long *)(in_RSI + 0xd8) == 0) {
    dense_parameters::begin(in_stack_ffffffffffffff20);
    while( true ) {
      dense_parameters::end(in_stack_ffffffffffffff20);
      bVar1 = dense_iterator<float>::operator!=(&local_40,&local_58);
      fVar10 = local_14;
      if (!bVar1) break;
      pfVar3 = dense_iterator<float>::operator*(&local_40);
      fVar7 = *pfVar3;
      pfVar3 = dense_iterator<float>::operator*(&local_40);
      pfVar3[1] = fVar10 * fVar7 + pfVar3[1];
      dVar9 = (double)local_14;
      pfVar3 = dense_iterator<float>::operator*(&local_40);
      fVar10 = *pfVar3;
      pfVar3 = dense_iterator<float>::operator*(&local_40);
      local_28 = dVar9 * 0.5 * (double)fVar10 * (double)*pfVar3 + local_28;
      dense_iterator<float>::operator++(&local_40);
    }
  }
  else {
    dense_parameters::begin(in_stack_ffffffffffffff20);
    while( true ) {
      dense_parameters::end(in_stack_ffffffffffffff20);
      rhs = &local_88;
      bVar1 = dense_iterator<float>::operator!=(&local_70,rhs);
      if (!bVar1) break;
      pcVar4 = dense_iterator<float>::index(&local_70,(char *)rhs,__c);
      uVar2 = dense_parameters::stride_shift(local_20);
      uVar6 = (ulong)pcVar4 >> ((byte)uVar2 & 0x3f);
      pfVar3 = dense_iterator<float>::operator*(&local_70);
      fVar7 = *pfVar3 - *(float *)(*(long *)(local_10 + 0xd8) + 4 + uVar6 * 8);
      fVar10 = *(float *)(*(long *)(local_10 + 0xd8) + uVar6 * 8);
      pfVar3 = dense_iterator<float>::operator*(&local_70);
      pfVar3[1] = fVar10 * fVar7 + pfVar3[1];
      local_28 = (double)*(float *)(*(long *)(local_10 + 0xd8) + uVar6 * 8) * 0.5 * (double)fVar7 *
                 (double)fVar7 + local_28;
      dense_iterator<float>::operator++(&local_70);
    }
  }
  fVar10 = local_14;
  if ((*(byte *)(local_8 + 0x330) & 1) != 0) {
    if (*(long *)(local_10 + 0xd8) == 0) {
      pwVar5 = dense_parameters::strided_index
                         ((dense_parameters *)
                          CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                          in_stack_ffffffffffffff08);
      fVar7 = *pwVar5;
      pwVar5 = dense_parameters::strided_index
                         ((dense_parameters *)
                          CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                          in_stack_ffffffffffffff08);
      pwVar5[1] = -fVar10 * fVar7 + pwVar5[1];
      dVar9 = (double)local_14 * 0.5;
      pwVar5 = dense_parameters::strided_index
                         ((dense_parameters *)
                          CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                          in_stack_ffffffffffffff08);
      fVar10 = *pwVar5;
      pwVar5 = dense_parameters::strided_index
                         ((dense_parameters *)
                          CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                          in_stack_ffffffffffffff08);
      local_28 = -(dVar9 * (double)fVar10) * (double)*pwVar5 + local_28;
    }
    else {
      uVar2 = dense_parameters::stride_shift(local_20);
      uVar6 = 0xb1c55cL >> ((byte)uVar2 & 0x3f);
      pwVar5 = dense_parameters::strided_index
                         ((dense_parameters *)
                          CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                          in_stack_ffffffffffffff08);
      fVar8 = *pwVar5 - *(float *)(*(long *)(local_10 + 0xd8) + 4 + uVar6 * 8);
      fVar10 = *(float *)(*(long *)(local_10 + 0xd8) + uVar6 * 8);
      fVar7 = fVar8;
      pwVar5 = dense_parameters::strided_index
                         ((dense_parameters *)CONCAT44(fVar8,fVar10),in_stack_ffffffffffffff08);
      pwVar5[1] = -fVar10 * fVar7 + pwVar5[1];
      local_28 = -((double)*(float *)(*(long *)(local_10 + 0xd8) + uVar6 * 8) * 0.5 * (double)fVar8)
                 * (double)fVar8 + local_28;
    }
  }
  return local_28;
}

Assistant:

double add_regularization(vw& all, bfgs& b, float regularization, T& weights)
{
  // compute the derivative difference
  double ret = 0.;

  if (b.regularizers == nullptr)
    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      (&(*w))[W_GT] += regularization * (*w);
      ret += 0.5 * regularization * (*w) * (*w);
    }
  else
    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      uint64_t i = w.index() >> weights.stride_shift();
      weight delta_weight = *w - b.regularizers[2 * i + 1];
      (&(*w))[W_GT] += b.regularizers[2 * i] * delta_weight;
      ret += 0.5 * b.regularizers[2 * i] * delta_weight * delta_weight;
    }

  // if we're not regularizing the intercept term, then subtract it off from the result above
  // when accessing weights[constant], always use weights.strided_index(constant)
  if (all.no_bias)
  {
    if (b.regularizers == nullptr)
    {
      (&weights.strided_index(constant))[W_GT] -= regularization * (weights.strided_index(constant));
      ret -= 0.5 * regularization * (weights.strided_index(constant)) * (weights.strided_index(constant));
    }
    else
    {
      uint64_t i = constant >> weights.stride_shift();
      weight delta_weight = (weights.strided_index(constant)) - b.regularizers[2 * i + 1];
      (&weights.strided_index(constant))[W_GT] -= b.regularizers[2 * i] * delta_weight;
      ret -= 0.5 * b.regularizers[2 * i] * delta_weight * delta_weight;
    }
  }

  return ret;
}